

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdVerifyTxSign(void *handle,int net_type,char *tx_hex,char *txid,uint32_t vout,char *address,
                   int address_type,char *direct_locking_script,int64_t value_satoshi,
                   char *value_bytedata)

{
  bool bVar1;
  AddressType AVar2;
  CfdException *pCVar3;
  AddressFactory *pAVar4;
  initializer_list<cfd::UtxoData> __l;
  bool is_bitcoin;
  allocator local_c89;
  void *local_c88;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ElementsAddressFactory address_factory_1;
  OutPoint outpoint;
  Amount amount;
  AddressFactory address_factory;
  ElementsConfidentialAddress confidential_addr;
  UtxoData utxo;
  
  local_c88 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex);
  if (bVar1) {
    utxo.block_height =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
         + 0x67;
    utxo.block_hash._vptr_BlockHash._0_4_ = 0x8c0;
    utxo.block_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "CfdVerifyTxSign";
    cfd::core::logger::warn<>((CfdSourceLocation *)&utxo,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&utxo,"Failed to parameter. tx is null or empty.",
               (allocator *)&confidential_addr);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&utxo);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    utxo.block_height =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
         + 0x67;
    utxo.block_hash._vptr_BlockHash._0_4_ = 0x8c6;
    utxo.block_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "CfdVerifyTxSign";
    cfd::core::logger::warn<>((CfdSourceLocation *)&utxo,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&utxo,"Failed to parameter. txid is null or empty.",
               (allocator *)&confidential_addr);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&utxo);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar2 = cfd::capi::ConvertAddressType(address_type);
  cfd::core::Amount::Amount(&amount,value_satoshi);
  std::__cxx11::string::string((string *)&confidential_addr,txid,(allocator *)&address_factory);
  cfd::core::Txid::Txid((Txid *)&utxo,(string *)&confidential_addr);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&utxo,vout);
  cfd::core::Txid::~Txid((Txid *)&utxo);
  std::__cxx11::string::~string((string *)&confidential_addr);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(net_type,&is_bitcoin);
  cfd::UtxoData::UtxoData(&utxo);
  utxo.address_type = kP2shAddress;
  utxo.block_height = 0;
  utxo.binary_data = (void *)0x0;
  std::__cxx11::string::assign((char *)&utxo.descriptor);
  cfd::core::OutPoint::GetTxid((Txid *)&confidential_addr,&outpoint);
  cfd::core::Txid::operator=(&utxo.txid,(Txid *)&confidential_addr);
  cfd::core::Txid::~Txid((Txid *)&confidential_addr);
  utxo.vout = cfd::core::OutPoint::GetVout(&outpoint);
  utxo.amount.amount_ = amount.amount_;
  utxo.amount.ignore_check_ = amount.ignore_check_;
  utxo.address_type = AVar2;
  bVar1 = cfd::capi::IsEmptyString(address);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
    if (bVar1) goto LAB_003b6529;
    std::__cxx11::string::string
              ((string *)&address_factory,direct_locking_script,(allocator *)&address_factory_1);
    cfd::core::Script::Script((Script *)&confidential_addr,(string *)&address_factory);
    cfd::core::Script::operator=(&utxo.locking_script,(Script *)&confidential_addr);
    cfd::core::Script::~Script((Script *)&confidential_addr);
    pAVar4 = &address_factory;
  }
  else {
    std::__cxx11::string::string((string *)&utxos,address,(allocator *)&confidential_addr);
    if (is_bitcoin == true) {
      cfd::AddressFactory::AddressFactory(&address_factory);
      cfd::AddressFactory::GetAddress
                (&confidential_addr.unblinded_address_,&address_factory,(string *)&utxos);
      cfd::core::Address::operator=(&utxo.address,&confidential_addr.unblinded_address_);
      cfd::core::Address::~Address(&confidential_addr.unblinded_address_);
      pAVar4 = &address_factory;
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory(&address_factory_1);
      bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)&utxos);
      if (bVar1) {
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                  (&confidential_addr,(string *)&utxos);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
                  ((Address *)&address_factory,&confidential_addr);
        cfd::core::Address::operator=(&utxo.address,(Address *)&address_factory);
        cfd::core::Address::~Address((Address *)&address_factory);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&confidential_addr);
      }
      else {
        cfd::AddressFactory::GetAddress
                  (&confidential_addr.unblinded_address_,&address_factory_1.super_AddressFactory,
                   (string *)&utxos);
        cfd::core::Address::operator=(&utxo.address,&confidential_addr.unblinded_address_);
        cfd::core::Address::~Address(&confidential_addr.unblinded_address_);
      }
      pAVar4 = &address_factory_1.super_AddressFactory;
    }
    cfd::AddressFactory::~AddressFactory(pAVar4);
    cfd::core::Address::GetLockingScript((Script *)&confidential_addr,&utxo.address);
    cfd::core::Script::operator=(&utxo.locking_script,(Script *)&confidential_addr);
    cfd::core::Script::~Script((Script *)&confidential_addr);
    pAVar4 = (AddressFactory *)&utxos;
  }
  std::__cxx11::string::~string((string *)pAVar4);
LAB_003b6529:
  cfd::UtxoData::UtxoData((UtxoData *)&confidential_addr,&utxo);
  __l._M_len = 1;
  __l._M_array = (iterator)&confidential_addr;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l,(allocator_type *)&address_factory);
  cfd::UtxoData::~UtxoData((UtxoData *)&confidential_addr);
  if (is_bitcoin == true) {
    std::__cxx11::string::string((string *)&address_factory,tx_hex,(allocator *)&address_factory_1);
    cfd::TransactionContext::TransactionContext
              ((TransactionContext *)&confidential_addr,(string *)&address_factory);
    std::__cxx11::string::~string((string *)&address_factory);
    cfd::TransactionContext::GetTxInIndex((TransactionContext *)&confidential_addr,&outpoint);
    cfd::TransactionContext::CollectInputUtxo((TransactionContext *)&confidential_addr,&utxos);
    cfd::TransactionContext::Verify((TransactionContext *)&confidential_addr,&outpoint);
    cfd::TransactionContext::~TransactionContext((TransactionContext *)&confidential_addr);
  }
  else {
    std::__cxx11::string::string((string *)&address_factory,tx_hex,(allocator *)&address_factory_1);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)&confidential_addr,(string *)&address_factory);
    std::__cxx11::string::~string((string *)&address_factory);
    bVar1 = cfd::capi::IsEmptyString(value_bytedata);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&address_factory_1,value_bytedata,&local_c89);
      cfd::core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&address_factory,(string *)&address_factory_1);
      cfd::core::ConfidentialValue::operator=
                (&utxo.value_commitment,(ConfidentialValue *)&address_factory);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&address_factory);
      std::__cxx11::string::~string((string *)&address_factory_1);
      cfd::UtxoData::operator=
                (utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                 super__Vector_impl_data._M_start,&utxo);
    }
    cfd::ConfidentialTransactionContext::GetTxInIndex
              ((ConfidentialTransactionContext *)&confidential_addr,&outpoint);
    cfd::ConfidentialTransactionContext::CollectInputUtxo
              ((ConfidentialTransactionContext *)&confidential_addr,&utxos);
    cfd::ConfidentialTransactionContext::Verify
              ((ConfidentialTransactionContext *)&confidential_addr,&outpoint);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)&confidential_addr);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::UtxoData::~UtxoData(&utxo);
  cfd::core::Txid::~Txid(&outpoint.txid_);
  return 0;
}

Assistant:

int CfdVerifyTxSign(
    void* handle, int net_type, const char* tx_hex, const char* txid,
    uint32_t vout, const char* address, int address_type,
    const char* direct_locking_script, int64_t value_satoshi,
    const char* value_bytedata) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    AddressType addr_type = ConvertAddressType(address_type);
    Amount amount = Amount(value_satoshi);
    OutPoint outpoint(Txid(txid), vout);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);

    UtxoData utxo;
    utxo.address_type = AddressType::kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = nullptr;
    utxo.descriptor = "";
    utxo.txid = outpoint.GetTxid();
    utxo.vout = outpoint.GetVout();
    utxo.address_type = addr_type;
    utxo.amount = amount;
    if (!IsEmptyString(address)) {
      std::string addr(address);
      if (is_bitcoin) {
        AddressFactory address_factory;
        utxo.address = address_factory.GetAddress(addr);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ElementsAddressFactory address_factory;
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          utxo.address = confidential_addr.GetUnblindedAddress();
        } else {
          utxo.address = address_factory.GetAddress(addr);
        }
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
      utxo.locking_script = utxo.address.GetLockingScript();
    } else if (!IsEmptyString(direct_locking_script)) {
      utxo.locking_script = Script(direct_locking_script);
    }
    std::vector<UtxoData> utxos = {utxo};

    if (is_bitcoin) {
      TransactionContext tx(tx_hex);
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex);
      if (!IsEmptyString(value_bytedata)) {
        utxo.value_commitment = ConfidentialValue(value_bytedata);
        utxos[0] = utxo;
      }
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    if (result != CfdErrorCode::kCfdSignVerificationError) {
      result = SetLastError(handle, except);
    } else {
      SetLastError(handle, except);  // collect error message
    }
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}